

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O0

void __thiscall mip_converter_test::MIPInstance::SparseVec::~SparseVec(SparseVec *this)

{
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

SparseVec(const std::vector<double>& c, const std::vector<int>& v) :
      c_(c), v_(v) { }